

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::state_updated(torrent *this)

{
  session_interface *psVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  value_type *pvVar4;
  vector<torrent_*> *list;
  torrent *this_local;
  
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x20 & 1) != 0) {
    psVar1 = (this->super_torrent_hot_members).m_ses;
    iVar3 = (*(psVar1->super_session_logger)._vptr_session_logger[0x3c])(psVar1,0);
    pvVar4 = container_wrapper<libtorrent::aux::link,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>,_std::array<libtorrent::aux::link,_8UL>_>
             ::operator[](&this->m_links,
                          (strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>)0x0);
    bVar2 = link::in_list(pvVar4);
    if (!bVar2) {
      pvVar4 = container_wrapper<libtorrent::aux::link,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>,_std::array<libtorrent::aux::link,_8UL>_>
               ::operator[](&this->m_links,
                            (strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>)0x0);
      link::insert<libtorrent::aux::torrent>
                (pvVar4,(vector<libtorrent::aux::torrent_*> *)CONCAT44(extraout_var,iVar3),this);
    }
  }
  return;
}

Assistant:

void torrent::state_updated()
	{
		// if this fails, this function is probably called
		// from within the torrent constructor, which it
		// shouldn't be. Whichever function ends up calling
		// this should probably be moved to torrent::start()
		TORRENT_ASSERT(shared_from_this());

		// we can't call state_updated() while the session
		// is building the status update alert
		TORRENT_ASSERT(!m_ses.is_posting_torrent_updates());

		// we're not subscribing to this torrent, don't add it
		if (!m_state_subscription) return;

		aux::vector<torrent*>& list = m_ses.torrent_list(aux::session_interface::torrent_state_updates);

		// if it has already been updated this round, no need to
		// add it to the list twice
		if (m_links[aux::session_interface::torrent_state_updates].in_list())
		{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
			TORRENT_ASSERT(find(list.begin(), list.end(), this) != list.end());
#endif
			return;
		}

#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		TORRENT_ASSERT(find(list.begin(), list.end(), this) == list.end());
#endif

		m_links[aux::session_interface::torrent_state_updates].insert(list, this);
	}